

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

int __thiscall
soplex::SPxDevexPR<double>::selectLeaveSparse(SPxDevexPR<double> *this,double feastol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  lVar10 = (long)(pSVar5->infeasibilities).super_IdxSet.num;
  if (lVar10 < 1) {
    iVar9 = -1;
  }
  else {
    pdVar6 = (pSVar5->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pSVar5->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (pSVar5->infeasibilities).super_IdxSet.idx;
    uVar11 = lVar10 + 1;
    dVar12 = 0.0;
    iVar9 = -1;
    do {
      iVar3 = piVar8[uVar11 - 2];
      dVar1 = pdVar6[iVar3];
      if (-feastol <= dVar1) {
        iVar4 = (pSVar5->infeasibilities).super_IdxSet.num;
        (pSVar5->infeasibilities).super_IdxSet.num = iVar4 + -1;
        piVar8[uVar11 - 2] = piVar8[(long)iVar4 + -1];
        (pSVar5->isInfeasible).data[iVar3] = 0;
      }
      else {
        dVar2 = pdVar7[iVar3];
        dVar13 = feastol;
        if (feastol <= dVar2) {
          dVar13 = dVar2;
        }
        dVar13 = (dVar1 * dVar1) / dVar13;
        if (dVar12 < dVar13) {
          this->last = dVar2;
          dVar12 = dVar13;
          iVar9 = iVar3;
        }
      }
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  return iVar9;
}

Assistant:

int SPxDevexPR<R>::selectLeaveSparse(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int idx = -1;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return bstI;
}